

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

float __thiscall QByteArray::toFloat(QByteArray *this,bool *ok)

{
  bool *in_RSI;
  QByteArray *in_RDI;
  float fVar1;
  bool *in_stack_ffffffffffffffe8;
  
  toDouble(in_RDI,in_RSI);
  fVar1 = QLocaleData::convertDoubleToFloat((double)in_RSI,in_stack_ffffffffffffffe8);
  return fVar1;
}

Assistant:

float QByteArray::toFloat(bool *ok) const
{
    return QLocaleData::convertDoubleToFloat(toDouble(ok), ok);
}